

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::NotEqualLayerParams::Clear(NotEqualLayerParams *this)

{
  this->alpha_ = 0.0;
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void NotEqualLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.NotEqualLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  alpha_ = 0;
  _internal_metadata_.Clear<std::string>();
}